

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void storeMappingData(void)

{
  uint c;
  undefined8 *puVar1;
  UBool UVar2;
  short sVar3;
  int32_t iVar4;
  uint32_t uVar5;
  UHashElement *pUVar6;
  long lVar7;
  int32_t local_3c;
  uint32_t savedTrieWord;
  int32_t limitIndex;
  int iStack_30;
  uint16_t trieWord;
  int32_t oldMappingLength;
  int32_t mappingLength;
  int32_t writtenElementCount;
  int32_t elementCount;
  int32_t codepoint;
  ValueStruct *value;
  UHashElement *element;
  int32_t pos;
  
  element._4_4_ = 0xffffffff;
  oldMappingLength = 0;
  iStack_30 = 1;
  limitIndex = 0;
  local_3c = 0;
  if (hashTable != (UHashtable *)0x0) {
    iVar4 = uhash_count_63(hashTable);
    mappingData = (uint16_t *)uprv_calloc_63((long)mappingDataCapacity,2);
    while (oldMappingLength < iVar4) {
      while (pUVar6 = uhash_nextElement_63(hashTable,(int32_t *)((long)&element + 4)),
            pUVar6 != (UHashElement *)0x0) {
        c = (pUVar6->key).integer;
        puVar1 = (undefined8 *)(pUVar6->value).pointer;
        if (limitIndex != iStack_30) {
          if ((limitIndex < 4) && (indexes[iStack_30 + 2] = (int)currentIndex, iStack_30 == 4)) {
            local_3c = (int32_t)currentIndex;
          }
          limitIndex = iStack_30;
        }
        if (*(short *)(puVar1 + 1) == iStack_30) {
          sVar3 = currentIndex * 4;
          savedTrieWord._2_2_ = sVar3 + 2;
          if (0xfff0 < savedTrieWord._2_2_) {
            fprintf(_stderr,"trieWord cannot contain value greater than 0x%04X.\n",0xfff0);
            exit(0xc);
          }
          uVar5 = utrie_get32_63(sprepTrie,c,(UBool *)0x0);
          if (uVar5 != 0) {
            if (uVar5 != 0xfff2) {
              fprintf(_stderr,"Type for codepoint \\U%08X already set!.\n",(ulong)c);
              exit(1);
            }
            savedTrieWord._2_2_ = sVar3 + 3;
          }
          UVar2 = utrie_set32_63(sprepTrie,c,(uint)savedTrieWord._2_2_);
          if (UVar2 == '\0') {
            fprintf(_stderr,"Could not set the value for code point.\n");
            exit(1);
          }
          oldMappingLength = oldMappingLength + 1;
          if (0x3fbf < (int)currentIndex + (int)*(short *)(puVar1 + 1) + 1) {
            fprintf(_stderr,"Too many entries in the mapping table %i. Maximum allowed is %i\n",
                    (ulong)(uint)((int)currentIndex + (int)*(short *)(puVar1 + 1)),0x3fbf);
            exit(8);
          }
          if (3 < iStack_30) {
            lVar7 = (long)currentIndex;
            currentIndex = currentIndex + 1;
            mappingData[lVar7] = (uint16_t)iStack_30;
          }
          u_memmove_63((UChar *)(mappingData + (int)currentIndex),(UChar *)*puVar1,
                       (int)*(short *)(puVar1 + 1));
          currentIndex = currentIndex + *(short *)(puVar1 + 1);
          if (mappingDataCapacity < currentIndex) {
            fprintf(_stderr,"gensprep, fatal error at %s, %d.  Aborting.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/gensprep/store.c"
                    ,0x14f);
            exit(5);
          }
        }
      }
      iStack_30 = iStack_30 + 1;
      element._4_4_ = 0xffffffff;
    }
    if (iStack_30 < 4) {
      indexes[iStack_30 + 2] = currentIndex + 1;
    }
    else {
      indexes[6] = local_3c;
    }
  }
  return;
}

Assistant:

static void 
storeMappingData(){

    int32_t pos = UHASH_FIRST;
    const UHashElement* element = NULL;
    ValueStruct* value  = NULL;
    int32_t codepoint = 0;
    int32_t elementCount = 0;
    int32_t writtenElementCount = 0;
    int32_t mappingLength = 1; /* minimum mapping length */
    int32_t oldMappingLength = 0;
    uint16_t trieWord =0;
    int32_t limitIndex = 0;

    if (hashTable == NULL) {
        return;
    }
    elementCount = uhash_count(hashTable);

	/*initialize the mapping data */
    mappingData = (uint16_t*) uprv_calloc(mappingDataCapacity, U_SIZEOF_UCHAR);

    while(writtenElementCount < elementCount){

        while( (element = uhash_nextElement(hashTable, &pos))!=NULL){
            
            codepoint = element->key.integer;
            value = (ValueStruct*)element->value.pointer;
            
            /* store the start of indexes */
            if(oldMappingLength != mappingLength){
                /* Assume that index[] is used according to the enums defined */
                if(oldMappingLength <=_SPREP_MAX_INDEX_TOP_LENGTH){
                    indexes[_SPREP_NORM_CORRECTNS_LAST_UNI_VERSION+mappingLength] = currentIndex;
                }
                if(oldMappingLength <= _SPREP_MAX_INDEX_TOP_LENGTH &&
                   mappingLength == _SPREP_MAX_INDEX_TOP_LENGTH +1){
                   
                    limitIndex = currentIndex;
                     
                }
                oldMappingLength = mappingLength;
            }

            if(value->length == mappingLength){
                uint32_t savedTrieWord = 0;
                trieWord = currentIndex << 2;
                /* turn on the 2nd bit to signal that the following bits contain an index */
                trieWord += 0x02;
            
                if(trieWord > _SPREP_TYPE_THRESHOLD){
                    fprintf(stderr,"trieWord cannot contain value greater than 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
                    exit(U_ILLEGAL_CHAR_FOUND);
                }
                /* figure out if the code point has type already stored */
                savedTrieWord= utrie_get32(sprepTrie,codepoint,NULL);
                if(savedTrieWord!=0){
                    if((savedTrieWord- _SPREP_TYPE_THRESHOLD) == USPREP_PROHIBITED){
                        /* turn on the first bit in trie word */
                        trieWord += 0x01;
                    }else{
                        /* 
                         * the codepoint has value something other than prohibited
                         * and a mapping .. error! 
                         */
                        fprintf(stderr,"Type for codepoint \\U%08X already set!.\n", (int)codepoint);
                        exit(U_ILLEGAL_ARGUMENT_ERROR); 
                    } 
                } 
                
                /* now set the value in the trie */
                if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                    fprintf(stderr,"Could not set the value for code point.\n");
                    exit(U_ILLEGAL_ARGUMENT_ERROR);   
                }

                /* written the trie word for the codepoint... increment the count*/
                writtenElementCount++;

                /* sanity check are we exceeding the max number allowed */
                if(currentIndex+value->length+1 > _SPREP_MAX_INDEX_VALUE){
                    fprintf(stderr, "Too many entries in the mapping table %i. Maximum allowed is %i\n", 
                        currentIndex+value->length, _SPREP_MAX_INDEX_VALUE);
                    exit(U_INDEX_OUTOFBOUNDS_ERROR);
                }

                /* copy the mapping data */
                /* write the length */
                if(mappingLength > _SPREP_MAX_INDEX_TOP_LENGTH ){
                     /* the cast here is safe since we donot expect the length to be > 65535 */
                     mappingData[currentIndex++] = (uint16_t) mappingLength;
                }
                /* copy the contents to mappindData array */
                u_memmove(mappingData+currentIndex, value->mapping, value->length);
                currentIndex += value->length;
                if (currentIndex > mappingDataCapacity) {
                    /* If this happens there is a bug in the computation of the mapping data size in storeMapping() */
                    fprintf(stderr, "gensprep, fatal error at %s, %d.  Aborting.\n", __FILE__, __LINE__);
                    exit(U_INTERNAL_PROGRAM_ERROR);
                }
            }
        }
        mappingLength++;
        pos = -1;
    }
    /* set the last length for range check */
    if(mappingLength <= _SPREP_MAX_INDEX_TOP_LENGTH){
        indexes[_SPREP_NORM_CORRECTNS_LAST_UNI_VERSION+mappingLength] = currentIndex+1;
    }else{
        indexes[_SPREP_FOUR_UCHARS_MAPPING_INDEX_START] = limitIndex;
    }
    
}